

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void __thiscall
TreePropagator::DFSBlue
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *visited,int *count)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  vector<bool,_std::allocator<bool>_> *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  reference rVar5;
  int other;
  int e0;
  int e1;
  int e;
  uint i;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  reference in_stack_ffffffffffffffa8;
  uint local_34;
  undefined4 in_stack_fffffffffffffff0;
  
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffa8._M_mask,
                     (size_type)in_stack_ffffffffffffffa8._M_p);
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd0,true);
  *(int *)&(in_RCX->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p =
       *(int *)&(in_RCX->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1;
  local_34 = 0;
  do {
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x68),(long)in_ESI);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
    if (sVar4 <= local_34) {
      return;
    }
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RDI + 0x68),(long)in_ESI);
    std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_34);
    GraphPropagator::getEdgeVar
              ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c);
    bVar1 = BoolView::isFixed((BoolView *)0x1e544f);
    if (bVar1) {
      GraphPropagator::getEdgeVar
                ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      bVar1 = BoolView::isFalse((BoolView *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (!bVar1) goto LAB_001e5476;
    }
    else {
LAB_001e5476:
      iVar2 = GraphPropagator::getEndnode
                        ((GraphPropagator *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff94 =
           GraphPropagator::getEndnode
                     ((GraphPropagator *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      if (in_stack_ffffffffffffff94 == in_ESI) {
        in_stack_ffffffffffffff94 = iVar2;
      }
      GraphPropagator::getNodeVar
                ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      bVar1 = BoolView::isFixed((BoolView *)0x1e54db);
      if (bVar1) {
        GraphPropagator::getNodeVar
                  ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
        bVar1 = BoolView::isFalse((BoolView *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (bVar1) goto LAB_001e5546;
      }
      in_stack_ffffffffffffffa8 =
           std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffa8._M_mask,
                      (size_type)in_stack_ffffffffffffffa8._M_p);
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffa8)
      ;
      if (!bVar1) {
        DFSBlue((TreePropagator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (int)((ulong)in_RDX >> 0x20),in_RCX,(int *)rVar5._M_mask);
      }
    }
LAB_001e5546:
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void TreePropagator::DFSBlue(int r, std::vector<bool>& visited, int& count) {
	visited[r] = true;
	count++;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			continue;
		}
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (getNodeVar(other).isFixed() && getNodeVar(other).isFalse()) {
			continue;
		}
		if (visited[other] == false) {
			DFSBlue(other, visited, count);
		}
	}
}